

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locresdata.cpp
# Opt level: O2

UChar * uloc_getTableStringWithFallback_63
                  (char *path,char *locale,char *tableKey,char *subTableKey,char *itemKey,
                  int32_t *pLength,UErrorCode *pErrorCode)

{
  int iVar1;
  UResourceBundle *resB;
  char *inKey;
  UChar *pUVar2;
  UErrorCode UVar3;
  char *pcVar4;
  UErrorCode errorCode;
  UChar *local_2a0;
  int32_t len;
  char *local_290;
  char *local_288;
  int32_t *local_280;
  char *local_278;
  char *local_270;
  char explicitFallbackName [157];
  UResourceBundle subTable;
  UResourceBundle table;
  
  local_288 = itemKey;
  local_280 = pLength;
  memset(explicitFallbackName,0,0x9d);
  errorCode = U_ZERO_ERROR;
  resB = ures_open_63(path,locale,&errorCode);
  if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((errorCode == U_USING_DEFAULT_WARNING) ||
       ((errorCode == U_ERROR_WARNING_START && (*pErrorCode != U_USING_DEFAULT_WARNING)))) {
      *pErrorCode = errorCode;
    }
    local_2a0 = (UChar *)0x0;
    local_290 = tableKey;
    local_278 = path;
    local_270 = locale;
    do {
      ures_initStackObject_63(&table);
      ures_initStackObject_63(&subTable);
      ures_getByKeyWithFallback_63(resB,tableKey,&table,&errorCode);
      if (subTableKey != (char *)0x0) {
        ures_getByKeyWithFallback_63(&table,subTableKey,&table,&errorCode);
      }
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_2a0 = ures_getStringByKeyWithFallback_63(&table,local_288,local_280,&errorCode);
        if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00282cb4;
        *pErrorCode = errorCode;
        errorCode = U_ZERO_ERROR;
        iVar1 = strcmp(tableKey,"Countries");
        pcVar4 = local_288;
        if (iVar1 == 0) {
          inKey = uloc_getCurrentCountryID_63(local_288);
        }
        else {
          iVar1 = strcmp(tableKey,"Languages");
          pcVar4 = local_288;
          if (iVar1 != 0) goto LAB_00282cb4;
          inKey = uloc_getCurrentLanguageID_63(local_288);
        }
        if (inKey == pcVar4 || inKey == (char *)0x0) {
          tableKey = local_290;
          if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00282cb4;
        }
        else {
          local_2a0 = ures_getStringByKeyWithFallback_63(&table,inKey,local_280,&errorCode);
          tableKey = local_290;
          if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            *pErrorCode = errorCode;
            goto LAB_00282cb4;
          }
        }
      }
      len = 0;
      *pErrorCode = errorCode;
      errorCode = U_ZERO_ERROR;
      pUVar2 = ures_getStringByKeyWithFallback_63(&table,"Fallback",&len,&errorCode);
      UVar3 = errorCode;
      if (U_ZERO_ERROR < errorCode) break;
      u_UCharsToChars_63(pUVar2,explicitFallbackName,len);
      iVar1 = strcmp(explicitFallbackName,local_270);
      if (iVar1 == 0) {
        UVar3 = U_INTERNAL_PROGRAM_ERROR;
        break;
      }
      ures_close_63(resB);
      resB = ures_open_63(local_278,explicitFallbackName,&errorCode);
      UVar3 = errorCode;
    } while (errorCode < U_ILLEGAL_ARGUMENT_ERROR);
    *pErrorCode = UVar3;
LAB_00282cb4:
    pUVar2 = local_2a0;
    ures_close_63(&subTable);
    ures_close_63(&table);
    ures_close_63(resB);
  }
  else {
    *pErrorCode = errorCode;
    pUVar2 = (UChar *)0x0;
  }
  return pUVar2;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
uloc_getTableStringWithFallback(const char *path, const char *locale,
                              const char *tableKey, const char *subTableKey,
                              const char *itemKey,
                              int32_t *pLength,
                              UErrorCode *pErrorCode)
{
/*    char localeBuffer[ULOC_FULLNAME_CAPACITY*4];*/
    UResourceBundle *rb=NULL, table, subTable;
    const UChar *item=NULL;
    UErrorCode errorCode;
    char explicitFallbackName[ULOC_FULLNAME_CAPACITY] = {0};

    /*
     * open the bundle for the current locale
     * this falls back through the locale's chain to root
     */
    errorCode=U_ZERO_ERROR;
    rb=ures_open(path, locale, &errorCode);

    if(U_FAILURE(errorCode)) {
        /* total failure, not even root could be opened */
        *pErrorCode=errorCode;
        return NULL;
    } else if(errorCode==U_USING_DEFAULT_WARNING ||
                (errorCode==U_USING_FALLBACK_WARNING && *pErrorCode!=U_USING_DEFAULT_WARNING)
    ) {
        /* set the "strongest" error code (success->fallback->default->failure) */
        *pErrorCode=errorCode;
    }

    for(;;){
        ures_initStackObject(&table);
        ures_initStackObject(&subTable);
        ures_getByKeyWithFallback(rb, tableKey, &table, &errorCode);

        if (subTableKey != NULL) {
            /*
            ures_getByKeyWithFallback(&table,subTableKey, &subTable, &errorCode);
            item = ures_getStringByKeyWithFallback(&subTable, itemKey, pLength, &errorCode);
            if(U_FAILURE(errorCode)){
                *pErrorCode = errorCode;
            }
            
            break;*/
            
            ures_getByKeyWithFallback(&table,subTableKey, &table, &errorCode);
        }
        if(U_SUCCESS(errorCode)){
            item = ures_getStringByKeyWithFallback(&table, itemKey, pLength, &errorCode);
            if(U_FAILURE(errorCode)){
                const char* replacement = NULL;
                *pErrorCode = errorCode; /*save the errorCode*/
                errorCode = U_ZERO_ERROR;
                /* may be a deprecated code */
                if(uprv_strcmp(tableKey, "Countries")==0){
                    replacement =  uloc_getCurrentCountryID(itemKey);
                }else if(uprv_strcmp(tableKey, "Languages")==0){
                    replacement =  uloc_getCurrentLanguageID(itemKey);
                }
                /*pointer comparison is ok since uloc_getCurrentCountryID & uloc_getCurrentLanguageID return the key itself is replacement is not found*/
                if(replacement!=NULL && itemKey != replacement){
                    item = ures_getStringByKeyWithFallback(&table, replacement, pLength, &errorCode);
                    if(U_SUCCESS(errorCode)){
                        *pErrorCode = errorCode;
                        break;
                    }
                }
            }else{
                break;
            }
        }
        
        if(U_FAILURE(errorCode)){    

            /* still can't figure out ?.. try the fallback mechanism */
            int32_t len = 0;
            const UChar* fallbackLocale =  NULL;
            *pErrorCode = errorCode;
            errorCode = U_ZERO_ERROR;

            fallbackLocale = ures_getStringByKeyWithFallback(&table, "Fallback", &len, &errorCode);
            if(U_FAILURE(errorCode)){
               *pErrorCode = errorCode;
                break;
            }
            
            u_UCharsToChars(fallbackLocale, explicitFallbackName, len);
            
            /* guard against recursive fallback */
            if(uprv_strcmp(explicitFallbackName, locale)==0){
                *pErrorCode = U_INTERNAL_PROGRAM_ERROR;
                break;
            }
            ures_close(rb);
            rb = ures_open(path, explicitFallbackName, &errorCode);
            if(U_FAILURE(errorCode)){
                *pErrorCode = errorCode;
                break;
            }
            /* succeeded in opening the fallback bundle .. continue and try to fetch the item */
        }else{
            break;
        }
    }
    /* done with the locale string - ready to close table and rb */
    ures_close(&subTable);
    ures_close(&table);
    ures_close(rb);
    return item;
}